

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgc2mgc.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined7 uVar6;
  size_t sVar5;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *__s;
  long lVar11;
  int iVar12;
  long lVar13;
  int output_num_order;
  int input_num_order;
  double input_gamma;
  double output_gamma;
  double output_alpha;
  double input_alpha;
  ostringstream error_message_11;
  vector<double,_std::allocator<double>_> transformed_mel_generalized_cepstrum;
  vector<double,_std::allocator<double>_> mel_generalized_cepstrum;
  ifstream ifs;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum mel_generalized_cepstrum_transform;
  Buffer buffer;
  int local_4f8;
  int local_4f4;
  double local_4f0;
  double local_4e8;
  ulong local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  double local_4c0;
  double local_4b8;
  string local_4b0;
  string *local_490;
  string local_488 [3];
  ios_base local_418 [264];
  vector<double,_std::allocator<double>_> local_310;
  vector<double,_std::allocator<double>_> local_2f8;
  string local_2e0;
  byte abStack_2c0 [80];
  ios_base local_270 [408];
  MelGeneralizedCepstrumToMelGeneralizedCepstrum local_d8;
  Buffer local_70;
  
  local_4f4 = 0x19;
  local_4b8 = 0.0;
  local_4f0 = 0.0;
  local_4f8 = 0x19;
  local_4d8 = 0;
  local_4c0 = 0.0;
  local_4e8 = 1.0;
  local_4c8 = 0;
  local_4e0 = 0;
  local_4d0 = 0;
  iVar12 = 0;
  do {
    paVar10 = &local_488[0].field_2;
    iVar4 = ya_getopt_long(argc,argv,"m:a:g:c:nuM:A:G:C:NUh",(option *)0x0,(int *)0x0);
    uVar6 = (undefined7)(CONCAT44(extraout_var,iVar4) >> 8);
    if (iVar4 < 0x55) {
      if (iVar4 < 0x47) {
        if (iVar4 == -1) {
          iVar4 = 2;
          goto LAB_00104031;
        }
        if (iVar4 != 0x41) {
          if (iVar4 == 0x43) {
            std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
            bVar1 = sptk::ConvertStringToInteger(&local_2e0,(int *)&local_d8);
            bVar2 = 0 < (int)local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p);
            }
            bVar8 = bVar1 && bVar2;
            if (!bVar1 || !bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2e0,
                         "The argument for the -C option must be a positive integer",0x39);
              local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
              sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
              goto LAB_00103edf;
            }
            local_4e8 = -1.0 / (double)(int)local_d8.
                                            _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
            goto LAB_00103c42;
          }
          goto switchD_00103914_caseD_62;
        }
        std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
        bVar2 = sptk::ConvertStringToDouble(&local_2e0,&local_4c0);
        if (bVar2) {
          bVar2 = sptk::IsValidAlpha(local_4c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
          if (bVar2) goto LAB_00103f21;
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -A option must be in (-1.0, 1.0)",
                   0x35);
        local_488[0]._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
      }
      else {
        if (iVar4 != 0x47) {
          if (iVar4 == 0x4d) {
            std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
            bVar2 = sptk::ConvertStringToInteger(&local_2e0,&local_4f8);
            bVar1 = local_4f8 < 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p);
            }
            if (!bVar2 || bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2e0,"The argument for the -M option must be a ",0x29);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2e0,"non-negative integer",0x14);
              local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
              sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
              goto LAB_00103ff8;
            }
          }
          else {
            if (iVar4 != 0x4e) goto switchD_00103914_caseD_62;
            local_4c8 = CONCAT71(uVar6,1);
          }
          goto LAB_00103f21;
        }
        std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
        bVar2 = sptk::ConvertStringToDouble(&local_2e0,&local_4e8);
        if (bVar2) {
          bVar2 = sptk::IsValidGamma(local_4e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
          if (bVar2) goto LAB_00103f21;
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -G option must be in [-1.0, 1.0]",
                   0x35);
        local_488[0]._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
      }
      goto LAB_00103ff8;
    }
    if (0xd < iVar4 - 0x61U) {
      if (iVar4 == 0x55) {
        local_4d8 = CONCAT71(uVar6,1);
      }
      else {
        if (iVar4 != 0x75) goto switchD_00103914_caseD_62;
        local_4e0 = CONCAT71(uVar6,1);
      }
      goto LAB_00103f21;
    }
    switch(iVar4) {
    case 0x61:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
      bVar2 = sptk::ConvertStringToDouble(&local_2e0,&local_4b8);
      if (bVar2) {
        bVar2 = sptk::IsValidAlpha(local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if (bVar2) goto LAB_00103f21;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"The argument for the -a option must be in (-1.0, 1.0)",0x35)
      ;
      local_488[0]._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
      goto LAB_00103ff8;
    default:
switchD_00103914_caseD_62:
      anon_unknown.dwarf_2d5e::PrintUsage((ostream *)&std::cerr);
      goto LAB_00104026;
    case 99:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
      bVar1 = sptk::ConvertStringToInteger(&local_2e0,(int *)&local_d8);
      bVar2 = 0 < (int)local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      bVar8 = bVar1 && bVar2;
      if (bVar1 && bVar2) {
        local_4f0 = -1.0 / (double)(int)local_d8.
                                        _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
LAB_00103c42:
        iVar4 = 4;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -c option must be a positive integer"
                   ,0x39);
        local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
LAB_00103edf:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488[0]._M_dataplus._M_p != &local_488[0].field_2) {
          operator_delete(local_488[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
        std::ios_base::~ios_base(local_270);
        iVar4 = 1;
        iVar12 = 1;
      }
      if (bVar8) goto LAB_00103f21;
      break;
    case 0x67:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
      bVar2 = sptk::ConvertStringToDouble(&local_2e0,&local_4f0);
      if (bVar2) {
        bVar2 = sptk::IsValidGamma(local_4f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if (bVar2) goto LAB_00103f21;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"The argument for the -g option must be in [-1.0, 1.0]",0x35)
      ;
      local_488[0]._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
LAB_00103ff8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488[0]._M_dataplus._M_p != &local_488[0].field_2) {
        operator_delete(local_488[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
      std::ios_base::~ios_base(local_270);
LAB_00104026:
      iVar4 = 1;
      iVar12 = 1;
      break;
    case 0x68:
      anon_unknown.dwarf_2d5e::PrintUsage((ostream *)&std::cout);
      iVar12 = 0;
      iVar4 = 1;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_488);
      bVar2 = sptk::ConvertStringToInteger(&local_2e0,&local_4f4);
      bVar1 = local_4f4 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"non-negative integer",0x14);
        local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
        goto LAB_00103ff8;
      }
      goto LAB_00103f21;
    case 0x6e:
      local_4d0 = CONCAT71((int7)((ulong)((long)&switchD_00103914::switchdataD_0010d018 +
                                         (long)(int)(&switchD_00103914::switchdataD_0010d018)
                                                    [iVar4 - 0x61U]) >> 8),1);
LAB_00103f21:
      iVar4 = 0;
    }
LAB_00104031:
  } while (iVar4 == 0);
  if (iVar4 == 2) {
    if (((local_4f0 != 0.0) || (NAN(local_4f0))) || ((local_4e0 & 1) == 0)) {
      if (argc - ya_optind < 2) {
        if (argc == ya_optind) {
          __s = (char *)0x0;
        }
        else {
          __s = argv[ya_optind];
        }
        bVar2 = sptk::SetBinaryMode();
        if (bVar2) {
          local_490 = &local_2e0;
          std::ifstream::ifstream(local_490);
          if ((__s == (char *)0x0) ||
             (std::ifstream::open((char *)&local_2e0,(_Ios_Openmode)__s),
             (abStack_2c0[*(long *)(local_2e0._M_dataplus._M_p + -0x18)] & 5) == 0)) {
            cVar3 = std::__basic_file<char>::is_open();
            if (cVar3 == '\0') {
              local_490 = (string *)&std::cin;
            }
            sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
            MelGeneralizedCepstrumToMelGeneralizedCepstrum
                      (&local_d8,local_4f4,local_4b8,local_4f0,(bool)((byte)local_4d0 & 1),
                       (bool)((byte)local_4e0 & 1),local_4f8,local_4c0,local_4e8,
                       (bool)((byte)local_4c8 & 1),(bool)((byte)local_4d8 & 1));
            local_70._vptr_Buffer = (_func_int **)&PTR__Buffer_00112a18;
            local_70.frequency_transform_buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00112a48;
            local_70.frequency_transform_buffer_.d_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_70.frequency_transform_buffer_.d_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_70.frequency_transform_buffer_.d_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_70.temporary_mel_generalized_cepstrum_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_70.temporary_mel_generalized_cepstrum_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_70.temporary_mel_generalized_cepstrum_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            if (local_d8.is_valid_ == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"Failed to initialize ",0x15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"MelGeneralizedCepstrumToMelGeneralizedCepstrum",0x2e)
              ;
              local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"mgc2mgc","");
              sptk::PrintErrorMessage(&local_4b0,(ostringstream *)local_488);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                operator_delete(local_4b0._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
              std::ios_base::~ios_base(local_418);
              iVar12 = 1;
            }
            else {
              lVar11 = (long)local_4f4;
              lVar13 = (long)local_4f8;
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_2f8,lVar11 + 1U,(allocator_type *)local_488);
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_310,lVar13 + 1U,(allocator_type *)local_488);
              bVar7 = (byte)local_4e0 ^ 1 | (byte)local_4d0;
              bVar9 = (byte)local_4d8 ^ 1 | (byte)local_4c8;
              do {
                bVar2 = sptk::ReadStream<double>
                                  (false,0,0,(int)(lVar11 + 1U),&local_2f8,(istream *)local_490,
                                   (int *)0x0);
                if (!bVar2) {
                  iVar12 = 0;
                  goto LAB_00104668;
                }
                if ((bVar7 & 1) == 0) {
                  *local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start =
                       (*local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + -1.0) / local_4f0;
                }
                bVar2 = sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
                                  (&local_d8,&local_2f8,&local_310,&local_70);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,
                             "Failed to run mel-generalized cepstral transformation",0x35);
                  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"mgc2mgc","")
                  ;
                  sptk::PrintErrorMessage(&local_4b0,(ostringstream *)local_488);
                  goto LAB_00104632;
                }
                if ((bVar9 & 1) == 0) {
                  *local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start =
                       *local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start * local_4e8 + 1.0;
                }
                bVar2 = sptk::WriteStream<double>
                                  (0,(int)(lVar13 + 1U),&local_310,(ostream *)&std::cout,(int *)0x0)
                ;
              } while (bVar2);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"Failed to write mel-generalized cepstrum",0x28);
              local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"mgc2mgc","");
              sptk::PrintErrorMessage(&local_4b0,(ostringstream *)local_488);
LAB_00104632:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                operator_delete(local_4b0._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
              std::ios_base::~ios_base(local_418);
              iVar12 = 1;
LAB_00104668:
              if (local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (double *)0x0) {
                operator_delete(local_310.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (double *)0x0) {
                operator_delete(local_2f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
            sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer::~Buffer(&local_70);
            sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
            ~MelGeneralizedCepstrumToMelGeneralizedCepstrum(&local_d8);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_488,"Cannot open file ",0x11);
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,__s,sVar5);
            local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum =
                 (_func_int **)&local_d8.input_alpha_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"mgc2mgc","");
            sptk::PrintErrorMessage((string *)&local_d8,(ostringstream *)local_488);
            if (local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum !=
                (_func_int **)&local_d8.input_alpha_) {
              operator_delete(local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
            std::ios_base::~ios_base(local_418);
            iVar12 = 1;
          }
          std::ifstream::~ifstream(&local_2e0);
          return iVar12;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"Cannot set translation mode",0x1b);
        local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"Too many input files",0x14);
        local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"If -u option is given, input gamma must not be 0",0x30);
      local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_2e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488[0]._M_dataplus._M_p != &local_488[0].field_2) {
      operator_delete(local_488[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
    std::ios_base::~ios_base(local_270);
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_num_order(kDefaultInputNumOrder);
  double input_alpha(kDefaultInputAlpha);
  double input_gamma(kDefaultInputGamma);
  bool input_normalization_flag(kDefaultInputNormalizationFlag);
  bool input_multiplication_flag(kDefaultInputMultiplicationFlag);
  int output_num_order(kDefaultOutputNumOrder);
  double output_alpha(kDefaultOutputAlpha);
  double output_gamma(kDefaultOutputGamma);
  bool output_normalization_flag(kDefaultOutputNormalizationFlag);
  bool output_multiplication_flag(kDefaultOutputMultiplicationFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:nuM:A:G:C:NUh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_num_order) ||
            input_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &input_alpha) ||
            !sptk::IsValidAlpha(input_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &input_gamma) ||
            !sptk::IsValidGamma(input_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        input_gamma = -1.0 / tmp;
        break;
      }
      case 'n': {
        input_normalization_flag = true;
        break;
      }
      case 'u': {
        input_multiplication_flag = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_num_order) ||
            output_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'A': {
        if (!sptk::ConvertStringToDouble(optarg, &output_alpha) ||
            !sptk::IsValidAlpha(output_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -A option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'G': {
        if (!sptk::ConvertStringToDouble(optarg, &output_gamma) ||
            !sptk::IsValidGamma(output_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -G option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'C': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -C option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        output_gamma = -1.0 / tmp;
        break;
      }
      case 'N': {
        output_normalization_flag = true;
        break;
      }
      case 'U': {
        output_multiplication_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0.0 == input_gamma && input_multiplication_flag) {
    std::ostringstream error_message;
    error_message << "If -u option is given, input gamma must not be 0";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum
      mel_generalized_cepstrum_transform(
          input_num_order, input_alpha, input_gamma, input_normalization_flag,
          input_multiplication_flag, output_num_order, output_alpha,
          output_gamma, output_normalization_flag, output_multiplication_flag);
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer buffer;
  if (!mel_generalized_cepstrum_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize "
                  << "MelGeneralizedCepstrumToMelGeneralizedCepstrum";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int input_length(input_num_order + 1);
  const int output_length(output_num_order + 1);
  std::vector<double> mel_generalized_cepstrum(input_length);
  std::vector<double> transformed_mel_generalized_cepstrum(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &mel_generalized_cepstrum,
                          &input_stream, NULL)) {
    // Perform input modification: 1+g*mgc[0] -> mgc[0]
    if (!input_normalization_flag && input_multiplication_flag)
      (*mel_generalized_cepstrum.begin()) =
          (*(mel_generalized_cepstrum.begin()) - 1.0) / input_gamma;

    // Transform.
    if (!mel_generalized_cepstrum_transform.Run(
            mel_generalized_cepstrum, &transformed_mel_generalized_cepstrum,
            &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral transformation";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }

    // Perform output modification: mgc[0] -> 1+g*mgc[0]
    if (!output_normalization_flag && output_multiplication_flag)
      (*transformed_mel_generalized_cepstrum.begin()) =
          *(transformed_mel_generalized_cepstrum.begin()) * output_gamma + 1.0;

    // Write results.
    if (!sptk::WriteStream(0, output_length,
                           transformed_mel_generalized_cepstrum, &std::cout,
                           NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }

  return 0;
}